

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

void pmu_op_start_arm(CPUARMState *env)

{
  uint32_t uVar1;
  undefined4 local_14;
  uint i;
  CPUARMState *env_local;
  
  pmccntr_op_start(env);
  local_14 = 0;
  while( true ) {
    uVar1 = pmu_num_counters(env);
    if (uVar1 <= local_14) break;
    pmevcntr_op_start(env,(uint8_t)local_14);
    local_14 = local_14 + 1;
  }
  return;
}

Assistant:

void pmu_op_start(CPUARMState *env)
{
    unsigned int i;
    pmccntr_op_start(env);
    for (i = 0; i < pmu_num_counters(env); i++) {
        pmevcntr_op_start(env, i);
    }
}